

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

ArrayBuilder<capnp::json::Value::Field::Reader> * __thiscall
kj::ArrayBuilder<capnp::json::Value::Field::Reader>::operator=
          (ArrayBuilder<capnp::json::Value::Field::Reader> *this,
          ArrayBuilder<capnp::json::Value::Field::Reader> *other)

{
  Reader *pRVar1;
  RemoveConst<capnp::json::Value::Field::Reader> *pRVar2;
  Reader *pRVar3;
  ArrayDisposer *pAVar4;
  
  pRVar1 = this->ptr;
  if (pRVar1 != (Reader *)0x0) {
    pRVar2 = this->pos;
    pRVar3 = this->endPtr;
    this->ptr = (Reader *)0x0;
    this->pos = (RemoveConst<capnp::json::Value::Field::Reader> *)0x0;
    this->endPtr = (Reader *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pRVar1,0x30,((long)pRVar2 - (long)pRVar1 >> 4) * -0x5555555555555555,
               ((long)pRVar3 - (long)pRVar1 >> 4) * -0x5555555555555555,0);
  }
  pRVar2 = other->pos;
  this->ptr = other->ptr;
  this->pos = pRVar2;
  pAVar4 = other->disposer;
  this->endPtr = other->endPtr;
  this->disposer = pAVar4;
  other->ptr = (Reader *)0x0;
  other->pos = (RemoveConst<capnp::json::Value::Field::Reader> *)0x0;
  other->endPtr = (Reader *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }